

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O1

void Omega_h::transfer_inherit_refine
               (Mesh *old_mesh,Mesh *new_mesh,LOs *keys2edges,Int prod_dim,LOs *keys2prods,
               LOs *prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents,TagBase *tagbase)

{
  int *piVar1;
  LOs same_ents2old_ents_00;
  LOs same_ents2old_ents_01;
  LOs same_ents2old_ents_02;
  LOs same_ents2old_ents_03;
  LOs same_ents2new_ents_00;
  LOs same_ents2new_ents_01;
  LOs same_ents2new_ents_02;
  LOs same_ents2new_ents_03;
  undefined8 uVar2;
  Alloc *pAVar3;
  undefined4 uVar4;
  Alloc *pAVar5;
  void *pvVar6;
  undefined4 in_stack_fffffffffffffe88;
  Alloc *local_170;
  undefined8 local_168;
  undefined1 local_160 [24];
  undefined1 local_148 [16];
  void *local_138;
  LOs local_130;
  Alloc *local_120;
  undefined8 local_118;
  undefined1 local_110 [24];
  undefined1 local_f8 [16];
  void *local_e8;
  LOs local_e0;
  Alloc *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [24];
  undefined1 local_a8 [16];
  void *local_98;
  LOs local_90;
  Alloc *local_80;
  undefined8 local_78;
  Alloc *local_70;
  _Alloc_hider local_68;
  undefined1 local_60 [16];
  LOs local_50;
  LOs local_40;
  
  uVar4 = (**(code **)((same_ents2new_ents.write_.shared_alloc_.alloc)->size + 0x10))
                    (same_ents2new_ents.write_.shared_alloc_.alloc);
  switch(uVar4) {
  case 0:
    local_40.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40.write_.shared_alloc_.alloc =
             (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.write_.shared_alloc_.alloc)->use_count =
             (local_40.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_40.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    local_50.write_.shared_alloc_.alloc = (keys2prods->write_).shared_alloc_.alloc;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.write_.shared_alloc_.alloc =
             (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_50.write_.shared_alloc_.alloc)->use_count =
             (local_50.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.write_.shared_alloc_.direct_ptr = (keys2prods->write_).shared_alloc_.direct_ptr;
    local_60._0_8_ = (prods2new_ents->write_).shared_alloc_.alloc;
    if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60._0_8_ = ((Alloc *)local_60._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_60._0_8_)->use_count = ((Alloc *)local_60._0_8_)->use_count + 1;
      }
    }
    local_60._8_8_ = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    local_70 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
    if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70 = (Alloc *)(local_70->size * 8 + 1);
      }
      else {
        local_70->use_count = local_70->use_count + 1;
      }
    }
    local_68._M_p = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
    local_80 = *same_ents2old_ents.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_80 = (Alloc *)(local_80->size * 8 + 1);
      }
      else {
        local_80->use_count = local_80->use_count + 1;
      }
    }
    local_78 = *(undefined8 *)((long)same_ents2old_ents.write_.shared_alloc_.direct_ptr + 8);
    pvVar6 = (void *)0x3fdfb2;
    pAVar5 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    same_ents2old_ents_01.write_.shared_alloc_.direct_ptr = &local_80;
    same_ents2old_ents_01.write_.shared_alloc_.alloc = (Alloc *)&local_70;
    same_ents2new_ents_01.write_.shared_alloc_.direct_ptr = pvVar6;
    same_ents2new_ents_01.write_.shared_alloc_.alloc = pAVar5;
    transfer_inherit_refine<signed_char>
              (old_mesh,new_mesh,&local_40,prod_dim,&local_50,(LOs *)local_60,same_ents2old_ents_01,
               same_ents2new_ents_01,(string *)CONCAT44(prod_dim,in_stack_fffffffffffffe88));
    pAVar5 = local_80;
    if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
      piVar1 = &local_80->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_80);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_70;
    if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
      piVar1 = &local_70->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70);
        operator_delete(pAVar5,0x48);
      }
    }
    uVar2 = local_60._0_8_;
    if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_60._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_60._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    pAVar3 = local_50.write_.shared_alloc_.alloc;
    pAVar5 = local_40.write_.shared_alloc_.alloc;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = (int *)((long)local_50.write_.shared_alloc_.alloc + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pAVar5 = local_40.write_.shared_alloc_.alloc;
      }
    }
    break;
  default:
    goto switchD_003fdb08_caseD_1;
  case 2:
    local_90.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc =
             (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_90.write_.shared_alloc_.alloc)->use_count =
             (local_90.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_90.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    local_a8._8_8_ = (keys2prods->write_).shared_alloc_.alloc;
    if ((local_a8._8_8_ & 7) == 0 && (Alloc *)local_a8._8_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8._8_8_ = ((Alloc *)local_a8._8_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_a8._8_8_)->use_count = ((Alloc *)local_a8._8_8_)->use_count + 1;
      }
    }
    local_98 = (keys2prods->write_).shared_alloc_.direct_ptr;
    local_c0._16_8_ = (prods2new_ents->write_).shared_alloc_.alloc;
    if ((local_c0._16_8_ & 7) == 0 && (Alloc *)local_c0._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0._16_8_ = ((Alloc *)local_c0._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_c0._16_8_)->use_count = ((Alloc *)local_c0._16_8_)->use_count + 1;
      }
    }
    local_a8._0_8_ = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    local_c0._0_8_ = (same_ents2old_ents.write_.shared_alloc_.alloc)->size;
    if ((local_c0._0_8_ & 7) == 0 && (Alloc *)local_c0._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0._0_8_ = ((Alloc *)local_c0._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_c0._0_8_)->use_count = ((Alloc *)local_c0._0_8_)->use_count + 1;
      }
    }
    local_c0._8_8_ = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
    local_d0 = *same_ents2old_ents.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0 = (Alloc *)(local_d0->size * 8 + 1);
      }
      else {
        local_d0->use_count = local_d0->use_count + 1;
      }
    }
    local_c8 = *(undefined8 *)((long)same_ents2old_ents.write_.shared_alloc_.direct_ptr + 8);
    pvVar6 = (void *)0x3fe217;
    pAVar5 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    same_ents2old_ents_02.write_.shared_alloc_.direct_ptr = &local_d0;
    same_ents2old_ents_02.write_.shared_alloc_.alloc = (Alloc *)local_c0;
    same_ents2new_ents_02.write_.shared_alloc_.direct_ptr = pvVar6;
    same_ents2new_ents_02.write_.shared_alloc_.alloc = pAVar5;
    transfer_inherit_refine<int>
              (old_mesh,new_mesh,&local_90,prod_dim,(LOs *)(local_a8 + 8),(LOs *)(local_c0 + 0x10),
               same_ents2old_ents_02,same_ents2new_ents_02,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe88));
    pAVar5 = local_d0;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      piVar1 = &local_d0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0);
        operator_delete(pAVar5,0x48);
      }
    }
    uVar2 = local_c0._0_8_;
    if ((local_c0._0_8_ & 7) == 0 && (Alloc *)local_c0._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_c0._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_c0._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    uVar2 = local_c0._16_8_;
    if ((local_c0._16_8_ & 7) == 0 && (Alloc *)local_c0._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_c0._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_c0._16_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    uVar2 = local_a8._8_8_;
    pAVar5 = local_90.write_.shared_alloc_.alloc;
    if ((local_a8._8_8_ & 7) == 0 && (Alloc *)local_a8._8_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_a8._8_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_a8._8_8_);
        operator_delete((void *)uVar2,0x48);
        pAVar5 = local_90.write_.shared_alloc_.alloc;
      }
    }
    break;
  case 3:
    local_e0.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e0.write_.shared_alloc_.alloc =
             (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e0.write_.shared_alloc_.alloc)->use_count =
             (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e0.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    local_f8._8_8_ = (keys2prods->write_).shared_alloc_.alloc;
    if ((local_f8._8_8_ & 7) == 0 && (Alloc *)local_f8._8_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f8._8_8_ = ((Alloc *)local_f8._8_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_f8._8_8_)->use_count = ((Alloc *)local_f8._8_8_)->use_count + 1;
      }
    }
    local_e8 = (keys2prods->write_).shared_alloc_.direct_ptr;
    local_110._16_8_ = (prods2new_ents->write_).shared_alloc_.alloc;
    if ((local_110._16_8_ & 7) == 0 && (Alloc *)local_110._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_110._16_8_ = ((Alloc *)local_110._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_110._16_8_)->use_count = ((Alloc *)local_110._16_8_)->use_count + 1;
      }
    }
    local_f8._0_8_ = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    local_110._0_8_ = (same_ents2old_ents.write_.shared_alloc_.alloc)->size;
    if ((local_110._0_8_ & 7) == 0 && (Alloc *)local_110._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_110._0_8_ = ((Alloc *)local_110._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_110._0_8_)->use_count = ((Alloc *)local_110._0_8_)->use_count + 1;
      }
    }
    local_110._8_8_ = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
    local_120 = *same_ents2old_ents.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_120 = (Alloc *)(local_120->size * 8 + 1);
      }
      else {
        local_120->use_count = local_120->use_count + 1;
      }
    }
    local_118 = *(undefined8 *)((long)same_ents2old_ents.write_.shared_alloc_.direct_ptr + 8);
    pvVar6 = (void *)0x3fdd5c;
    pAVar5 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    same_ents2old_ents_00.write_.shared_alloc_.direct_ptr = &local_120;
    same_ents2old_ents_00.write_.shared_alloc_.alloc = (Alloc *)local_110;
    same_ents2new_ents_00.write_.shared_alloc_.direct_ptr = pvVar6;
    same_ents2new_ents_00.write_.shared_alloc_.alloc = pAVar5;
    transfer_inherit_refine<long>
              (old_mesh,new_mesh,&local_e0,prod_dim,(LOs *)(local_f8 + 8),(LOs *)(local_110 + 0x10),
               same_ents2old_ents_00,same_ents2new_ents_00,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe88));
    pAVar5 = local_120;
    if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
      piVar1 = &local_120->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_120);
        operator_delete(pAVar5,0x48);
      }
    }
    uVar2 = local_110._0_8_;
    if ((local_110._0_8_ & 7) == 0 && (Alloc *)local_110._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_110._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_110._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    uVar2 = local_110._16_8_;
    if ((local_110._16_8_ & 7) == 0 && (Alloc *)local_110._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_110._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_110._16_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    uVar2 = local_f8._8_8_;
    pAVar5 = local_e0.write_.shared_alloc_.alloc;
    if ((local_f8._8_8_ & 7) == 0 && (Alloc *)local_f8._8_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_f8._8_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_f8._8_8_);
        operator_delete((void *)uVar2,0x48);
        pAVar5 = local_e0.write_.shared_alloc_.alloc;
      }
    }
    break;
  case 5:
    local_130.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
        local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_130.write_.shared_alloc_.alloc =
             (Alloc *)((local_130.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_130.write_.shared_alloc_.alloc)->use_count =
             (local_130.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_130.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    local_148._8_8_ = (keys2prods->write_).shared_alloc_.alloc;
    if ((local_148._8_8_ & 7) == 0 && (Alloc *)local_148._8_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148._8_8_ = ((Alloc *)local_148._8_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_148._8_8_)->use_count = ((Alloc *)local_148._8_8_)->use_count + 1;
      }
    }
    local_138 = (keys2prods->write_).shared_alloc_.direct_ptr;
    local_160._16_8_ = (prods2new_ents->write_).shared_alloc_.alloc;
    if ((local_160._16_8_ & 7) == 0 && (Alloc *)local_160._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_160._16_8_ = ((Alloc *)local_160._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_160._16_8_)->use_count = ((Alloc *)local_160._16_8_)->use_count + 1;
      }
    }
    local_148._0_8_ = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    local_160._0_8_ = (same_ents2old_ents.write_.shared_alloc_.alloc)->size;
    if ((local_160._0_8_ & 7) == 0 && (Alloc *)local_160._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_160._0_8_ = ((Alloc *)local_160._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_160._0_8_)->use_count = ((Alloc *)local_160._0_8_)->use_count + 1;
      }
    }
    local_160._8_8_ = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
    local_170 = *same_ents2old_ents.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170 = (Alloc *)(local_170->size * 8 + 1);
      }
      else {
        local_170->use_count = local_170->use_count + 1;
      }
    }
    local_168 = *(undefined8 *)((long)same_ents2old_ents.write_.shared_alloc_.direct_ptr + 8);
    pvVar6 = (void *)0x3fe455;
    pAVar5 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    same_ents2old_ents_03.write_.shared_alloc_.direct_ptr = &local_170;
    same_ents2old_ents_03.write_.shared_alloc_.alloc = (Alloc *)local_160;
    same_ents2new_ents_03.write_.shared_alloc_.direct_ptr = pvVar6;
    same_ents2new_ents_03.write_.shared_alloc_.alloc = pAVar5;
    transfer_inherit_refine<double>
              (old_mesh,new_mesh,&local_130,prod_dim,(LOs *)(local_148 + 8),
               (LOs *)(local_160 + 0x10),same_ents2old_ents_03,same_ents2new_ents_03,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe88));
    pAVar5 = local_170;
    if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
      piVar1 = &local_170->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_170);
        operator_delete(pAVar5,0x48);
      }
    }
    uVar2 = local_160._0_8_;
    if ((local_160._0_8_ & 7) == 0 && (Alloc *)local_160._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_160._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_160._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    uVar2 = local_160._16_8_;
    if ((local_160._16_8_ & 7) == 0 && (Alloc *)local_160._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_160._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_160._16_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    uVar2 = local_148._8_8_;
    pAVar5 = local_130.write_.shared_alloc_.alloc;
    if ((local_148._8_8_ & 7) == 0 && (Alloc *)local_148._8_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_148._8_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_148._8_8_);
        operator_delete((void *)uVar2,0x48);
        pAVar5 = local_130.write_.shared_alloc_.alloc;
      }
    }
  }
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
switchD_003fdb08_caseD_1:
  return;
}

Assistant:

void transfer_inherit_refine(Mesh* old_mesh, Mesh* new_mesh, LOs keys2edges,
    Int prod_dim, LOs keys2prods, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, TagBase const* tagbase) {
  switch (tagbase->type()) {
    case OMEGA_H_I8:
      transfer_inherit_refine<I8>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_I32:
      transfer_inherit_refine<I32>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_I64:
      transfer_inherit_refine<I64>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_F64:
      transfer_inherit_refine<Real>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
  }
}